

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_icctagtabent_cmp(void *src,void *dst)

{
  jas_icctagtabent_t *dsttagtabent;
  jas_icctagtabent_t *srctagtabent;
  void *dst_local;
  void *src_local;
  
  if (*(ulong *)((long)dst + 8) < *(ulong *)((long)src + 8)) {
    src_local._4_4_ = 1;
  }
  else if (*(ulong *)((long)src + 8) < *(ulong *)((long)dst + 8)) {
    src_local._4_4_ = -1;
  }
  else {
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static int jas_icctagtabent_cmp(const void *src, const void *dst)
{
	const jas_icctagtabent_t *srctagtabent = JAS_CAST(const jas_icctagtabent_t *, src);
	const jas_icctagtabent_t *dsttagtabent = JAS_CAST(const jas_icctagtabent_t *, dst);
	if (srctagtabent->off > dsttagtabent->off) {
		return 1;
	} else if (srctagtabent->off < dsttagtabent->off) {
		return -1;
	}
	return 0;
}